

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O2

int __thiscall CVmTimeZoneCache::load_db_index(CVmTimeZoneCache *this)

{
  uint *puVar1;
  byte bVar2;
  uint uVar3;
  ZoneHashEntry *link_to;
  uint uVar4;
  FILE *__stream;
  size_t sVar5;
  char *pcVar6;
  undefined8 *puVar7;
  ZoneHashEntryDb *this_00;
  ZoneHashEntryLink *this_01;
  CVmHashTable *pCVar8;
  CVmHashFunc *hash_function;
  AbbrHashEntry *this_02;
  long lVar9;
  undefined8 uVar10;
  uint uVar11;
  undefined8 *puVar12;
  ulong uVar13;
  byte *pbVar14;
  uint *puVar15;
  uint uVar16;
  byte *pbVar17;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  char buf [24];
  
  if (this->index_loaded_ != 0) {
    return this->index_loaded_ok_;
  }
  this->index_loaded_ = 1;
  __stream = (FILE *)open_zoneinfo_file();
  if (__stream == (FILE *)0x0) {
    return 0;
  }
  sVar5 = fread(buf,0x18,1,__stream);
  if (sVar5 != 1) {
    buf._20_4_ = 0;
    local_70 = 0;
LAB_002818d2:
    local_80 = 0;
    local_78 = 0;
    uVar16 = 0;
    uVar11 = buf._20_4_;
    goto LAB_00281947;
  }
  local_80 = 0;
  local_70 = 0;
  local_78 = 0;
  uVar16 = 0;
  uVar11 = 0;
  if (buf._0_4_ != 0x5a543354) goto LAB_00281947;
  local_70 = (ulong)(buf._16_4_ - 4);
  pcVar6 = (char *)operator_new__(local_70);
  this->zone_bytes_ = pcVar6;
  sVar5 = fread(pcVar6,local_70,1,__stream);
  if (sVar5 != 1) goto LAB_002818d2;
  sVar5 = fread(buf,8,1,__stream);
  uVar16 = 0;
  uVar11 = buf._20_4_;
  if (sVar5 == 1) {
    local_80 = (ulong)(buf._0_4_ - 4);
    pcVar6 = (char *)operator_new__(local_80);
    this->link_bytes_ = pcVar6;
    sVar5 = fread(pcVar6,local_80,1,__stream);
    if (sVar5 == 1) goto LAB_002818e9;
  }
  else {
    local_80 = 0;
LAB_002818e9:
    sVar5 = fread(buf,8,1,__stream);
    if (sVar5 == 1) {
      local_78 = (ulong)(buf._0_4_ - 4);
      pcVar6 = (char *)operator_new__(local_78);
      this->abbr_bytes_ = pcVar6;
      sVar5 = fread(pcVar6,local_78,1,__stream);
      uVar16 = (uint)(sVar5 == 1);
      goto LAB_00281947;
    }
    uVar16 = 1;
  }
  local_78 = 0;
LAB_00281947:
  fclose(__stream);
  if (uVar16 != 0) {
    puVar7 = (undefined8 *)operator_new__((ulong)uVar11 << 3);
    pbVar17 = (byte *)this->zone_bytes_;
    pbVar14 = pbVar17 + local_70;
    puVar12 = puVar7;
    for (; pbVar17 < pbVar14; pbVar17 = pbVar17 + uVar13 + 8) {
      uVar13 = (ulong)*pbVar17;
      this_00 = (ZoneHashEntryDb *)operator_new(0x48);
      ZoneHashEntryDb::ZoneHashEntryDb
                (this_00,(char *)(pbVar17 + 1),uVar13,0,*(uint32_t *)(pbVar17 + uVar13 + 2),
                 (char *)(pbVar17 + uVar13 + 6));
      CVmHashTable::add(this->db_tab_,(CVmHashEntry *)this_00);
      *puVar12 = this_00;
      puVar12 = puVar12 + 1;
    }
    pbVar14 = (byte *)this->link_bytes_;
    pbVar17 = pbVar14 + local_80;
    for (; pbVar14 < pbVar17; pbVar14 = pbVar14 + uVar13 + 6) {
      uVar13 = (ulong)*pbVar14;
      if ((*(uint *)(pbVar14 + uVar13 + 2) < uVar11) &&
         (link_to = (ZoneHashEntry *)puVar7[*(uint *)(pbVar14 + uVar13 + 2)],
         link_to != (ZoneHashEntry *)0x0)) {
        pCVar8 = this->db_tab_;
        this_01 = (ZoneHashEntryLink *)operator_new(0x50);
        ZoneHashEntryLink::ZoneHashEntryLink(this_01,(char *)(pbVar14 + 1),uVar13,0,link_to);
        CVmHashTable::add(pCVar8,(CVmHashEntry *)this_01);
      }
    }
    pCVar8 = (CVmHashTable *)operator_new(0x20);
    hash_function = (CVmHashFunc *)operator_new(8);
    hash_function->_vptr_CVmHashFunc = (_func_int **)&PTR__CVmHashFunc_0035e868;
    CVmHashTable::CVmHashTable(pCVar8,0x40,hash_function,1);
    this->abbr_tab_ = pCVar8;
    puVar15 = (uint *)this->abbr_bytes_;
    puVar1 = (uint *)(local_78 + (long)puVar15);
    while (puVar15 < puVar1) {
      uVar13 = (ulong)(byte)*puVar15;
      bVar2 = *(byte *)((long)puVar15 + uVar13 + 2);
      this_02 = (AbbrHashEntry *)operator_new(0x30);
      AbbrHashEntry::AbbrHashEntry(this_02,(char *)((long)puVar15 + 1),uVar13,0,(uint)bVar2);
      CVmHashTable::add(this->abbr_tab_,(CVmHashEntry *)this_02);
      puVar15 = (uint *)((long)puVar15 + uVar13 + 3);
      for (lVar9 = 0; (ulong)bVar2 * 0x10 != lVar9; lVar9 = lVar9 + 0x10) {
        if (*puVar15 < uVar11) {
          uVar10 = puVar7[*puVar15];
        }
        else {
          uVar10 = 0;
        }
        uVar3 = puVar15[1];
        uVar4 = puVar15[2];
        *(undefined8 *)((long)&this_02->entries->zone + lVar9) = uVar10;
        *(uint *)((long)&this_02->entries->gmtofs + lVar9) = uVar3;
        (&this_02->entries->dst)[lVar9] = (byte)uVar4;
        puVar15 = (uint *)((long)puVar15 + 9);
      }
    }
    operator_delete__(puVar7);
  }
  this->index_loaded_ok_ = uVar16;
  return uVar16;
}

Assistant:

int CVmTimeZoneCache::load_db_index(VMG0_)
{
    /* if we've already loaded the index (or tried to), we're done */
    if (index_loaded_)
        return index_loaded_ok_;

    /* we've now tried loading the index */
    index_loaded_ = TRUE;

    /* open the zone file */
    osfildef *fp = open_zoneinfo_file(vmg0_);
    if (fp == 0)
        return FALSE;

    /* read the signature */
    char buf[24];
    int ok = !osfrb(fp, buf, 24) && memcmp(buf, "T3TZ", 4) == 0;

    /* if the signature checked out, read the zone table */
    uint32_t zone_table_len = 0, zone_cnt = 0;
    if (ok)
    {
        /* decode the zone name table length */
        zone_table_len = osrp4(buf + 16) - 4;
        zone_cnt = osrp4(buf + 20);
        
        /* allocate space to load the table */
        zone_bytes_ = new char[zone_table_len];

        /* read the table */
        ok = zone_bytes_ != 0 && !osfrb(fp, zone_bytes_, zone_table_len);
    }

    /* if everything is working so far, read the link table */
    uint32_t link_table_len = 0;
    if (ok && !osfrb(fp, buf, 8))
    {
        /* load the link table */
        link_table_len = osrp4(buf) - 4;
        /* uint32_t link_cnt = osrp4(buf+4) - not currently needed */
        link_bytes_ = new char[link_table_len];
        ok = link_bytes_ != 0 && !osfrb(fp, link_bytes_, link_table_len);
    }

    /* if we're still good, read the abbreviation mappings */
    uint32_t abbr_table_len = 0;
    if (ok && !osfrb(fp, buf, 8))
    {
        /* load the abbreviation table */
        abbr_table_len = osrp4(buf) - 4;
        /* uint32_t abbr_cnt = osrp4(buf + 4) - not currently needed */
        abbr_bytes_ = new char[abbr_table_len];
        ok = abbr_bytes_ != 0 && !osfrb(fp, abbr_bytes_, abbr_table_len);
    }

    /* we're done with the file */
    osfcls(fp);

    /* if we read the zone table successfully, create a hash table from it */
    ZoneHashEntry **zone_index = 0;
    if (ok)
    {
        /* create the numerical index */
        zone_index = new ZoneHashEntry *[zone_cnt];

        /* populate it */
        const char *zone_end = zone_bytes_ + zone_table_len;
        int zi = 0;
        for (const char *p = zone_bytes_ ; p < zone_end ; )
        {
            /* read and skip the name length prefix */
            size_t len = osrp1(p);
            ++p;

            /* create this entry */
            ZoneHashEntry *e = new ZoneHashEntryDb(
                p, len, FALSE, osrp4(p+len+1), p+len+1+4);

            /* add it to the hash table and zone index */
            db_tab_->add(e);
            zone_index[zi++] = e;

            /* skip the name, seek pointer, and country code */
            p += len + 1 + 4 + 2;
        }

        /* read the links */
        const char *link_end = link_bytes_ + link_table_len;
        for (const char *p = link_bytes_ ; p < link_end ; )
        {
            /* read and skip the name length */
            size_t len = osrp1(p);
            ++p;

            /* read the TO index */
            unsigned int to = osrp4(p + len + 1);
            
            /* look up the TO field */
            ZoneHashEntry *e_to = (to < zone_cnt ? zone_index[to] : 0);

            /* if we found it, create the new entry for the FROM */
            if (e_to != 0)
                db_tab_->add(new ZoneHashEntryLink(p, len, FALSE, e_to));

            /* skip the entry */
            p += len + 1 + 4;
        }
    }

    /* if there are no errors so far, read the abbreviation table */
    if (ok)
    {
        /* create the abbreviation hash table */
        abbr_tab_ = new CVmHashTable(64, new CVmHashFuncCI(), TRUE);

        /* populate it */
        const char *abbr_end = abbr_bytes_ + abbr_table_len;
        for (const char *p = abbr_bytes_ ; p < abbr_end ; )
        {
            /* read and skip the abbreviation length prefix */
            size_t len = osrp1(p);
            ++p;

            /* read the number of zone entries */
            int entry_cnt = osrp1(p + len + 1);

            /* create and add the hash table entry */
            AbbrHashEntry *e = new AbbrHashEntry(p, len, FALSE, entry_cnt);
            abbr_tab_->add(e);

            /* populate the entry */
            int ei;
            for (p += len + 1 + 1, ei = 0 ; ei < entry_cnt ; p += 9, ++ei)
            {
                /* look up the zone */
                uint32_t zi = osrp4(p);
                ZoneHashEntry *zone = (zi < zone_cnt ? zone_index[zi] : 0);
                
                /* add the entry */
                e->set_zone(ei, zone, osrp4s(p+4), p[8]);
            }
        }
    }

    /* we're done with the numerical zone index */
    if (zone_index != 0)
        delete [] zone_index;

    /* return the status */
    index_loaded_ok_ = ok;
    return ok;
}